

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_numerators.hpp
# Opt level: O3

void __thiscall
random_numerators<unsigned_long>::random_numerators(random_numerators<unsigned_long> *this)

{
  uint uVar1;
  int iVar2;
  time_t tVar3;
  uint32_t *puVar4;
  uint32_t uVar5;
  uint uVar6;
  long lVar7;
  
  this->_length = 0x80000;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar2 = rand();
  uVar5 = iVar2 * 0x400 + (iVar2 / 3) * -0xc00 + this->_length;
  this->_length = uVar5;
  puVar4 = allocate(this,uVar5 * 8);
  this->_pData = puVar4;
  uVar1 = this->_length;
  if ((ulong)uVar1 != 0) {
    iVar2 = 0x369e91e9;
    uVar6 = 0x7fffffab;
    lVar7 = 0;
    do {
      uVar6 = (uVar6 >> 0x10 | uVar6 << 0x10) + iVar2;
      *(uint *)((long)puVar4 + lVar7) = uVar6;
      iVar2 = iVar2 + uVar6;
      lVar7 = lVar7 + 4;
    } while ((ulong)uVar1 << 3 != lVar7);
  }
  return;
}

Assistant:

random_numerators() {
#if defined(__AVR__)
        // Using 1/8 of free RAM should be enough to fool the 
        // compiler optimizer and give enough test iterations on
        // AVR hardware
        _length = (freeRAM()/8)/sizeof(T);
#else
        _length = 1 << 19;
        // Make sure that the number of iterations is not
        // known at compile time to prevent the compiler
        // from magically calculating results at compile
        // time and hence falsifying the benchmark.        
        srand((unsigned)time(NULL));
        _length += (rand() % 3) * (1 << 10);
#endif 
        _pData = allocate(_length * sizeof(T));

        randomize_buffer();
    }